

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::PointLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PointLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  float fVar16;
  float fVar22;
  float fVar23;
  undefined1 auVar17 [16];
  float fVar25;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar26 [16];
  SampledSpectrum SVar27;
  undefined1 auVar15 [56];
  undefined1 auVar24 [56];
  
  auVar9 = ZEXT816(0) << 0x40;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0))
                            ,auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0])
                           );
  auVar10 = vfmadd231ss_fma(auVar10,auVar9,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar4 = auVar10._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0))
                            ,auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0])
                           );
  auVar10 = vfmadd231ss_fma(auVar10,auVar9,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar5 = auVar10._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0])
                           );
  auVar10 = vfmadd231ss_fma(auVar10,auVar9,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)),
                           auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]));
  auVar6 = vfmadd231ss_fma(auVar6,auVar9,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar16 = auVar6._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar16 == 1.0;
  fVar8 = auVar10._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar9 = ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar16));
  fVar8 = (float)((uint)bVar3 * (int)fVar8 + (uint)!bVar3 * (int)(fVar8 / fVar16));
  auVar6 = vinsertps_avx(auVar9,ZEXT416((uint)bVar3 * (int)fVar5 +
                                        (uint)!bVar3 * (int)(fVar5 / fVar16)),0x10);
  auVar10 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                          ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar17._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar10._0_4_;
  auVar17._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar10._4_4_;
  auVar17._8_4_ = auVar10._8_4_ + 0.0;
  auVar17._12_4_ = auVar10._12_4_ + 0.0;
  auVar10._8_4_ = 0xbf000000;
  auVar10._0_8_ = 0xbf000000bf000000;
  auVar10._12_4_ = 0xbf000000;
  auVar10 = vmulps_avx512vl(auVar17,auVar10);
  fVar16 = auVar6._0_4_ + auVar10._0_4_;
  fVar22 = auVar6._4_4_ + auVar10._4_4_;
  fVar23 = auVar6._8_4_ + auVar10._8_4_;
  fVar25 = auVar6._12_4_ + auVar10._12_4_;
  auVar18._0_4_ = fVar16 * fVar16;
  auVar18._4_4_ = fVar22 * fVar22;
  auVar18._8_4_ = fVar23 * fVar23;
  auVar18._12_4_ = fVar25 * fVar25;
  auVar10 = vhaddps_avx(auVar18,auVar18);
  auVar24 = ZEXT856(auVar10._8_8_);
  fVar4 = fVar8 + (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                   low + ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  fVar5 = auVar10._0_4_ + fVar4 * fVar4;
  if (fVar5 < 0.0) {
    auVar24 = ZEXT856(auVar10._8_8_);
    fVar11 = sqrtf(fVar5);
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar11 = auVar10._0_4_;
  }
  fVar1 = this->scale;
  auVar12._4_4_ = fVar1;
  auVar12._0_4_ = fVar1;
  auVar12._8_4_ = fVar1;
  auVar12._12_4_ = fVar1;
  auVar15 = ZEXT856(auVar12._8_8_);
  SVar27 = DenselySampledSpectrum::Sample(&this->I,&lambda);
  auVar21._0_8_ = SVar27.values.values._8_8_;
  auVar21._8_56_ = auVar24;
  auVar14._0_8_ = SVar27.values.values._0_8_;
  auVar14._8_56_ = auVar15;
  auVar10 = vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
  auVar13._0_4_ = auVar10._0_4_ * fVar1;
  auVar13._4_4_ = auVar10._4_4_ * fVar1;
  auVar13._8_4_ = auVar10._8_4_ * fVar1;
  auVar13._12_4_ = auVar10._12_4_ * fVar1;
  auVar19._4_4_ = fVar5;
  auVar19._0_4_ = fVar5;
  auVar19._8_4_ = fVar5;
  auVar19._12_4_ = fVar5;
  auVar10 = vdivps_avx(auVar13,auVar19);
  auVar20._4_4_ = fVar11;
  auVar20._0_4_ = fVar11;
  auVar20._8_4_ = fVar11;
  auVar20._12_4_ = fVar11;
  auVar7._4_4_ = fVar22;
  auVar7._0_4_ = fVar16;
  auVar7._8_4_ = fVar23;
  auVar7._12_4_ = fVar25;
  auVar17 = vdivps_avx(auVar7,auVar20);
  auVar26._4_4_ = fVar8;
  auVar26._0_4_ = fVar8;
  auVar26._8_4_ = fVar8;
  auVar26._12_4_ = fVar8;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar10;
  uVar2 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar4 / fVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  auVar10 = vshufps_avx(auVar9,auVar6,0x50);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar10;
  uVar2 = vmovlps_avx(auVar26);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Point3f p = renderFromLight(Point3f(0, 0, 0));
        Vector3f wi = Normalize(p - ctx.p());
        SampledSpectrum Li = scale * I.Sample(lambda) / DistanceSquared(p, ctx.p());
        return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
    }